

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# koch_snowflake.c
# Opt level: O0

int main(int argc,char **argv)

{
  bov_text_param_t parameters;
  undefined1 auVar1 [48];
  int iVar2;
  GLfloat (*coords_00) [2];
  GLuint *indices_00;
  bov_points_t *points;
  bov_order_t *order_00;
  bov_text_t *text;
  undefined4 *local_128;
  undefined4 uStack_11c;
  undefined8 uStack_118;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined8 uStack_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  GLubyte local_dd [29];
  bov_text_t *local_c0;
  bov_text_t *end;
  double dStack_b0;
  GLfloat s;
  double tnow;
  double tbegin;
  GLfloat GStack_98;
  int i;
  GLfloat outColor [4];
  GLfloat fillColor [4];
  size_t sStack_70;
  GLfloat segWidth;
  size_t nSegment;
  bov_order_t *order;
  bov_points_t *pointset;
  GLuint *indices;
  GLfloat (*coords) [2];
  size_t maxPoints;
  size_t maxSegment;
  GLfloat local_30;
  int maxIters;
  undefined4 local_28;
  undefined4 local_24;
  bov_window_t *local_20;
  bov_window_t *window;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (bov_window_t *)argv;
  argv_local._0_4_ = argc;
  local_20 = bov_window_new(0x400,0x280,*argv);
  local_30 = 0.3;
  maxIters = 0x3e99999a;
  local_28 = 0x3e99999a;
  local_24 = 0x3f800000;
  bov_window_set_color(local_20,&local_30);
  coords_00 = (GLfloat (*) [2])malloc(0x2008);
  indices_00 = (GLuint *)malloc(0x100c);
  points = bov_points_new((GLfloat (*) [2])0x0,0x401,0x88e4);
  order_00 = bov_order_new((GLuint *)0x0,0x403,0x88e8);
  sStack_70 = 1;
  fillColor[3] = 0.33;
  (*coords_00)[0] = -0.66999996;
  (*coords_00)[1] = -0.1;
  coords_00[0x400][0] = 0.66999996;
  coords_00[0x400][1] = -0.1;
  outColor[2] = 1.0;
  outColor[3] = 1.0;
  _GStack_98 = 0x3f0000003f333333;
  outColor[0] = 0.0;
  outColor[1] = 2.0;
  bov_points_set_color(points,&GStack_98);
  bov_points_set_outline_color(points,outColor + 2);
  for (tbegin._4_4_ = 0; tbegin._4_4_ < 4; tbegin._4_4_ = tbegin._4_4_ + 1) {
    indices_update(indices_00,sStack_70 << 2,0x400);
    bov_order_update(order_00,indices_00,(int)(sStack_70 << 2) + 3);
    dStack_b0 = bov_window_get_time(local_20);
    tnow = dStack_b0;
    while (dStack_b0 - tnow < 1.3) {
      end._4_4_ = (float)((dStack_b0 - tnow) / 1.3);
      coords_update(coords_00,indices_00,sStack_70,end._4_4_);
      bov_points_update(points,coords_00,0x401);
      parameters_update(points,fillColor[3],end._4_4_);
      bov_curve_draw_with_order(local_20,points,order_00,0,0x7fffffff);
      bov_window_update(local_20);
      dStack_b0 = bov_window_get_time(local_20);
      iVar2 = bov_window_should_close(local_20);
      if (iVar2 != 0) goto LAB_00105abe;
    }
    sStack_70 = sStack_70 << 2;
    fillColor[3] = fillColor[3] * 0.33333334;
  }
  builtin_memcpy(local_dd,"Max. iteration level reached",0x1d);
  text = bov_text_new(local_dd,0x88e4);
  local_128 = &uStack_11c;
  local_c0 = text;
  do {
    *local_128 = 0;
    local_128 = local_128 + 1;
  } while (local_128 != &local_110);
  local_110 = 0x3f800000;
  uStack_10c = 0x3f800000;
  uStack_108 = 0x3f800000;
  uStack_104 = 0x3f800000;
  local_100 = 0x42800000;
  uStack_fc = 0x42800000;
  memset(&uStack_f8,0,8);
  local_f0 = 0x42800000;
  uStack_ec = 0x3e99999a;
  uStack_e8 = 0x3f800000;
  uStack_e4 = 2;
  auVar1._16_4_ = uStack_10c;
  auVar1._12_4_ = local_110;
  auVar1._24_4_ = uStack_104;
  auVar1._20_4_ = uStack_108;
  auVar1._32_4_ = uStack_fc;
  auVar1._28_4_ = local_100;
  auVar1._4_8_ = uStack_118;
  auVar1._0_4_ = uStack_11c;
  auVar1._36_8_ = uStack_f8;
  auVar1._44_4_ = 0;
  auVar1 = auVar1 << 0x20;
  parameters.fontSize = 64.0;
  parameters.boldness = 0.3;
  parameters.fillColor[0] = (GLfloat)auVar1._0_4_;
  parameters.fillColor[1] = (GLfloat)auVar1._4_4_;
  parameters.fillColor[2] = (GLfloat)auVar1._8_4_;
  parameters.fillColor[3] = (GLfloat)auVar1._12_4_;
  parameters.outlineColor[0] = (GLfloat)auVar1._16_4_;
  parameters.outlineColor[1] = (GLfloat)auVar1._20_4_;
  parameters.outlineColor[2] = (GLfloat)auVar1._24_4_;
  parameters.outlineColor[3] = (GLfloat)auVar1._28_4_;
  parameters.pos[0] = (GLfloat)auVar1._32_4_;
  parameters.pos[1] = (GLfloat)auVar1._36_4_;
  parameters.shift[0] = (GLfloat)auVar1._40_4_;
  parameters.shift[1] = (GLfloat)auVar1._44_4_;
  parameters.outlineWidth = 1.0;
  parameters.spaceType = PIXEL_SPACE;
  bov_text_set_param(text,parameters);
  parameters_update(points,fillColor[3],0.0);
  bov_points_update(points,coords_00,0x401);
  while (iVar2 = bov_window_should_close(local_20), iVar2 == 0) {
    bov_curve_draw_with_order(local_20,points,order_00,0,0x7fffffff);
    bov_text_draw(local_20,local_c0);
    bov_window_update_and_wait_events(local_20);
  }
  bov_text_delete(local_c0);
LAB_00105abe:
  bov_order_delete(order_00);
  free(indices_00);
  bov_points_delete(points);
  free(coords_00);
  bov_window_delete(local_20);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	bov_window_t* window = bov_window_new(1024, 640, argv[0]);
	bov_window_set_color(window, (GLfloat[4]) {0.3, 0.3, 0.3, 1.0});

	const int maxIters = 5;
	const size_t maxSegment = 1ULL << (2 * maxIters); // 4^maxIter with bits operations
	const size_t maxPoints = maxSegment + 1;

	// allocations
	GLfloat (*coords)[2] = malloc(2 * sizeof(GLfloat) * maxPoints);
	GLuint* indices = malloc(sizeof(GLuint) * (maxPoints + 2));
	bov_points_t* pointset = bov_points_new(NULL, maxPoints, GL_STATIC_DRAW); // GPU mirror of coords
	bov_order_t* order = bov_order_new(NULL, maxPoints + 2, GL_DYNAMIC_DRAW); // GPU mirror of indices

	// initialization
	size_t nSegment = 1;                // nPoints = nSegment+1
	GLfloat segWidth = ORIGINAL_SEGWIDTH; // the width of each segments

	coords[0][0] = -1.0 + segWidth;
	coords[0][1] = -0.1;
	coords[maxSegment][0] = 1.0 - segWidth;
	coords[maxSegment][1] = -0.1;

	// we set those parameters once and for all, other parameters
	// will be updated during the animation
	GLfloat fillColor[4] = {1, 1, 1, 1};
	GLfloat outColor[4] = {0.7, 0.5, 0.0, 2.0};
	bov_points_set_color(pointset, outColor);
	bov_points_set_outline_color(pointset, fillColor);

	// iterations
	for(int i=0; i<maxIters-1; i++) {
		indices_update(indices, 4 * nSegment, maxSegment);
		bov_order_update(order, indices, 4 * nSegment + 3);

		// animation (here we recompute the points each times)
		double tbegin = bov_window_get_time(window);
		double tnow = tbegin;
		while(tnow - tbegin < TRANSITION_TIME) {
			// interpolation factor
			GLfloat s = (tnow - tbegin)/TRANSITION_TIME;

			coords_update(coords, indices, nSegment, s);
			bov_points_update(pointset, coords, maxPoints);
			parameters_update(pointset, segWidth, s);

			bov_curve_draw_with_order(window, pointset, order, 0, BOV_TILL_END);
			bov_window_update(window);

			tnow = bov_window_get_time(window);

			if(bov_window_should_close(window))
				goto end_of_program;
		}

		nSegment *= 4;
		segWidth *= 1.0 / 3.0;
	}

	bov_text_t* end = bov_text_new((GLubyte[]){"Max. iteration level reached"}, GL_STATIC_DRAW);
	bov_text_set_param(end, (bov_text_param_t) {
	  .spaceType = PIXEL_SPACE,
	  .fontSize = 64,
	  .pos = {64, 64},
	  .fillColor = {0},          // transparent
	  .outlineColor = {1, 1, 1, 1}, // white
	  .boldness = 0.3,
	  .outlineWidth = 1.0
	});

	parameters_update(pointset, segWidth, 0);
	bov_points_update(pointset, coords, maxPoints);

	while(!bov_window_should_close(window)) {
		bov_curve_draw_with_order(window, pointset, order, 0, BOV_TILL_END);
		bov_text_draw(window, end);
		bov_window_update_and_wait_events(window);
	}

	bov_text_delete(end);

end_of_program:

	bov_order_delete(order);
	free(indices);
	bov_points_delete(pointset);
	free(coords);
	bov_window_delete(window);

	return EXIT_SUCCESS;
}